

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerHLSL::to_resource_binding_sampler_abi_cxx11_
          (string *__return_storage_ptr__,CompilerHLSL *this,SPIRVariable *var)

{
  bool bVar1;
  uint32_t binding;
  uint32_t space_set;
  allocator local_25;
  uint32_t local_24;
  SPIRVariable *local_20;
  SPIRVariable *var_local;
  CompilerHLSL *this_local;
  
  local_24 = (var->super_IVariant).self.id;
  local_20 = var;
  var_local = (SPIRVariable *)this;
  this_local = (CompilerHLSL *)__return_storage_ptr__;
  bVar1 = Compiler::has_decoration((Compiler *)this,(ID)local_24,DecorationBinding);
  if (bVar1) {
    binding = Compiler::get_decoration
                        ((Compiler *)this,(ID)(local_20->super_IVariant).self.id,DecorationBinding);
    space_set = Compiler::get_decoration
                          ((Compiler *)this,(ID)(local_20->super_IVariant).self.id,
                           DecorationDescriptorSet);
    to_resource_register_abi_cxx11_
              (__return_storage_ptr__,this,HLSL_BINDING_AUTO_SAMPLER_BIT,'s',binding,space_set);
  }
  else {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_25);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_25);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerHLSL::to_resource_binding_sampler(const SPIRVariable &var)
{
	// For combined image samplers.
	if (!has_decoration(var.self, DecorationBinding))
		return "";

	return to_resource_register(HLSL_BINDING_AUTO_SAMPLER_BIT, 's', get_decoration(var.self, DecorationBinding),
	                            get_decoration(var.self, DecorationDescriptorSet));
}